

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# join.hpp
# Opt level: O0

iterator_range<burst::detail::join_iterator_impl<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Fwd_list_const_iterator<int>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Fwd_list_const_iterator<int>_>_>_>_>_>,_boost::iterators::forward_traversal_tag>_>
* __thiscall
burst::join_t::operator()
          (iterator_range<burst::detail::join_iterator_impl<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Fwd_list_const_iterator<int>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Fwd_list_const_iterator<int>_>_>_>_>_>,_boost::iterators::forward_traversal_tag>_>
           *__return_storage_ptr__,join_t *this,
          tuple<const_std::vector<int,_std::allocator<int>_>_&,_const_std::vector<int,_std::allocator<int>_>_&,_const_std::forward_list<int,_std::allocator<int>_>_&>
          *args)

{
  iterator *this_00;
  join_iterator_impl<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Fwd_list_const_iterator<int>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Fwd_list_const_iterator<int>_>_>_>_>_>,_boost::iterators::forward_traversal_tag>
  *in_RCX;
  tuple<const_std::vector<int,_std::allocator<int>_>_&,_const_std::vector<int,_std::allocator<int>_>_&,_const_std::forward_list<int,_std::allocator<int>_>_&>
  *ranges;
  join_iterator_impl<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Fwd_list_const_iterator<int>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Fwd_list_const_iterator<int>_>_>_>_>_>,_boost::iterators::forward_traversal_tag>
  local_110;
  join_iterator_impl<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Fwd_list_const_iterator<int>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Fwd_list_const_iterator<int>_>_>_>_>_>,_boost::iterators::forward_traversal_tag>
  local_e0;
  undefined1 local_98 [8];
  join_iterator<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int>_>,_std::_Fwd_list_const_iterator<int>_>_>_>_>_>
  end;
  undefined1 local_50 [8];
  join_iterator<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int>_>,_std::_Fwd_list_const_iterator<int>_>_>_>_>_>
  begin;
  tuple<const_std::vector<int,_std::allocator<int>_>_&,_const_std::vector<int,_std::allocator<int>_>_&,_const_std::forward_list<int,_std::allocator<int>_>_&>
  *args_local;
  join_t *this_local;
  
  this_00 = &end.m_end.m_iterator;
  begin.m_end.m_iterator._M_current =
       (iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Fwd_list_const_iterator<int>_>_>
        *)args;
  std::
  tuple<const_std::vector<int,_std::allocator<int>_>_&,_const_std::vector<int,_std::allocator<int>_>_&,_const_std::forward_list<int,_std::allocator<int>_>_&>
  ::tuple((tuple<const_std::vector<int,_std::allocator<int>_>_&,_const_std::vector<int,_std::allocator<int>_>_&,_const_std::forward_list<int,_std::allocator<int>_>_&>
           *)this_00,args);
  make_join_iterator<std::vector<int,std::allocator<int>>const,std::vector<int,std::allocator<int>>const,std::forward_list<int,std::allocator<int>>const>
            ((join_iterator<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int>_>,_std::_Fwd_list_const_iterator<int>_>_>_>_>_>
              *)local_50,(burst *)this_00,ranges);
  make_join_iterator<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,std::_Fwd_list_const_iterator<int>>>,std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,std::_Fwd_list_const_iterator<int>>>>>>>
            (local_98,(burst *)local_50);
  burst::detail::
  join_iterator_impl<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Fwd_list_const_iterator<int>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Fwd_list_const_iterator<int>_>_>_>_>_>,_boost::iterators::forward_traversal_tag>
  ::join_iterator_impl
            (&local_e0,
             (join_iterator_impl<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Fwd_list_const_iterator<int>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Fwd_list_const_iterator<int>_>_>_>_>_>,_boost::iterators::forward_traversal_tag>
              *)local_50);
  burst::detail::
  join_iterator_impl<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Fwd_list_const_iterator<int>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Fwd_list_const_iterator<int>_>_>_>_>_>,_boost::iterators::forward_traversal_tag>
  ::join_iterator_impl
            (&local_110,
             (join_iterator_impl<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Fwd_list_const_iterator<int>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Fwd_list_const_iterator<int>_>_>_>_>_>,_boost::iterators::forward_traversal_tag>
              *)local_98);
  boost::
  make_iterator_range<burst::detail::join_iterator_impl<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,std::_Fwd_list_const_iterator<int>>>,std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,std::_Fwd_list_const_iterator<int>>>>>>,boost::iterators::forward_traversal_tag>>
            (__return_storage_ptr__,(boost *)&local_e0,&local_110,in_RCX);
  burst::detail::
  join_iterator_impl<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Fwd_list_const_iterator<int>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Fwd_list_const_iterator<int>_>_>_>_>_>,_boost::iterators::forward_traversal_tag>
  ::~join_iterator_impl(&local_110);
  burst::detail::
  join_iterator_impl<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Fwd_list_const_iterator<int>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Fwd_list_const_iterator<int>_>_>_>_>_>,_boost::iterators::forward_traversal_tag>
  ::~join_iterator_impl(&local_e0);
  burst::detail::
  join_iterator_impl<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Fwd_list_const_iterator<int>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Fwd_list_const_iterator<int>_>_>_>_>_>,_boost::iterators::forward_traversal_tag>
  ::~join_iterator_impl
            ((join_iterator_impl<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Fwd_list_const_iterator<int>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Fwd_list_const_iterator<int>_>_>_>_>_>,_boost::iterators::forward_traversal_tag>
              *)local_98);
  burst::detail::
  join_iterator_impl<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Fwd_list_const_iterator<int>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Fwd_list_const_iterator<int>_>_>_>_>_>,_boost::iterators::forward_traversal_tag>
  ::~join_iterator_impl
            ((join_iterator_impl<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Fwd_list_const_iterator<int>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Fwd_list_const_iterator<int>_>_>_>_>_>,_boost::iterators::forward_traversal_tag>
              *)local_50);
  return __return_storage_ptr__;
}

Assistant:

auto operator () (Args && ... args) const
        {
            auto begin = make_join_iterator(std::forward<Args>(args)...);
            auto end = make_join_iterator(iterator::end_tag, begin);

            return boost::make_iterator_range(std::move(begin), std::move(end));
        }